

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
cmConditionEvaluator::GetBooleanValueWithAutoDereference
          (cmConditionEvaluator *this,cmExpandedCommandArgument *newArg,string *errorString,
          MessageType *status,bool oneArg)

{
  PolicyStatus PVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  PolicyID id;
  PolicyID id_00;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->Policy12Status == OLD) {
    bVar2 = GetBooleanValueOld(this,newArg,oneArg);
    return bVar2;
  }
  if (this->Policy12Status != NEW) {
    bVar3 = GetBooleanValue(this,newArg);
    bVar4 = GetBooleanValueOld(this,newArg,oneArg);
    bVar2 = bVar3;
    if (bVar3 != bVar4) {
      PVar1 = this->Policy12Status;
      if (PVar1 - REQUIRED_IF_USED < 2) {
        std::operator+(&local_70,"An argument named \"",&newArg->Value);
        std::operator+(&local_90,&local_70,"\" appears in a conditional statement.  ");
        cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_b0,(cmPolicies *)0xc,id_00);
        std::operator+(&local_50,&local_90,&local_b0);
        std::__cxx11::string::operator=((string *)errorString,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_70);
        *status = FATAL_ERROR;
      }
      else {
        bVar2 = bVar4;
        if ((PVar1 != OLD) && (bVar2 = bVar3, PVar1 == WARN)) {
          std::operator+(&local_70,"An argument named \"",&newArg->Value);
          std::operator+(&local_90,&local_70,"\" appears in a conditional statement.  ");
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_b0,(cmPolicies *)0xc,id);
          std::operator+(&local_50,&local_90,&local_b0);
          std::__cxx11::string::operator=((string *)errorString,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_70);
          *status = AUTHOR_WARNING;
          bVar2 = bVar4;
        }
      }
    }
    return bVar2;
  }
  bVar2 = GetBooleanValue(this,newArg);
  return bVar2;
}

Assistant:

bool cmConditionEvaluator::GetBooleanValueWithAutoDereference(
  cmExpandedCommandArgument &newArg,
  std::string &errorString,
  cmake::MessageType &status,
  bool oneArg) const
{
  // Use the policy if it is set.
  if (this->Policy12Status == cmPolicies::NEW)
    {
    return GetBooleanValue(newArg);
    }
  else if (this->Policy12Status == cmPolicies::OLD)
    {
    return GetBooleanValueOld(newArg, oneArg);
    }

  // Check policy only if old and new results differ.
  bool newResult = this->GetBooleanValue(newArg);
  bool oldResult = this->GetBooleanValueOld(newArg, oneArg);
  if(newResult != oldResult)
    {
    switch(this->Policy12Status)
      {
      case cmPolicies::WARN:
        {
        errorString = "An argument named \"" + newArg.GetValue()
          + "\" appears in a conditional statement.  "
          + cmPolicies::GetPolicyWarning(cmPolicies::CMP0012);
        status = cmake::AUTHOR_WARNING;
        }
      case cmPolicies::OLD:
        return oldResult;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        {
        errorString = "An argument named \"" + newArg.GetValue()
          + "\" appears in a conditional statement.  "
          + cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0012);
        status = cmake::FATAL_ERROR;
        }
      case cmPolicies::NEW:
        break;
      }
    }
  return newResult;
}